

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O1

ListSegment *
duckdb::CreatePrimitiveSegment<long>
          (ListSegmentFunctions *param_1,ArenaAllocator *allocator,uint16_t capacity)

{
  ListSegment *pLVar1;
  undefined2 in_register_00000012;
  
  pLVar1 = (ListSegment *)
           ArenaAllocator::Allocate
                     (allocator,
                      (ulong)(CONCAT22(in_register_00000012,capacity) * 9 + 0x17U & 0xfffffff8));
  pLVar1->capacity = capacity;
  pLVar1->count = 0;
  pLVar1->next = (ListSegment *)0x0;
  return pLVar1;
}

Assistant:

static ListSegment *CreatePrimitiveSegment(const ListSegmentFunctions &, ArenaAllocator &allocator, uint16_t capacity) {
	// allocate data and set the header
	auto segment = reinterpret_cast<ListSegment *>(AllocatePrimitiveData<T>(allocator, capacity));
	segment->capacity = capacity;
	segment->count = 0;
	segment->next = nullptr;
	return segment;
}